

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singly_linked_list.cpp
# Opt level: O2

bool si9ma::SinglyLinkedList::is_palindroom2(SinglyNodeWithRand *head)

{
  _Elt_pointer piVar1;
  SinglyNodeWithRand *pSVar2;
  stack<int,_std::deque<int,_std::allocator<int>_>_> s_stack;
  _Deque_base<int,_std::allocator<int>_> _Stack_68;
  
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&_Stack_68);
  for (pSVar2 = head; pSVar2 != (SinglyNodeWithRand *)0x0; pSVar2 = pSVar2->next) {
    std::deque<int,_std::allocator<int>_>::push_back
              ((deque<int,_std::allocator<int>_> *)&_Stack_68,&pSVar2->value);
  }
  while (head != (SinglyNodeWithRand *)0x0) {
    piVar1 = _Stack_68._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (_Stack_68._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        _Stack_68._M_impl.super__Deque_impl_data._M_finish._M_first) {
      piVar1 = _Stack_68._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    if (head->value != piVar1[-1]) break;
    head = head->next;
    std::deque<int,_std::allocator<int>_>::pop_back((deque<int,_std::allocator<int>_> *)&_Stack_68);
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&_Stack_68);
  return head == (SinglyNodeWithRand *)0x0;
}

Assistant:

bool SinglyLinkedList::is_palindroom2(si9ma::SinglyNodeWithRand *head) {
        auto *ptr = head;
        stack<int> s_stack;
        while (ptr != nullptr){
            s_stack.push(ptr->value);
            ptr = ptr->next;
        }

        ptr = head;
        while (ptr != nullptr){
            if (ptr->value != s_stack.top())
                return false;

            ptr = ptr->next;
            s_stack.pop();
        }

        return true;
    }